

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_perf_strided.c
# Opt level: O0

void grid_factor(int p,int *idx,int *idy)

{
  bool bVar1;
  int iVar2;
  int *in_RDX;
  int *in_RSI;
  int in_EDI;
  double dVar3;
  int ichk;
  int iy;
  int ix;
  int fac [256];
  int prime [256];
  int pmax;
  int ifac;
  int ip;
  int j;
  int i;
  int local_838 [256];
  int aiStack_438 [259];
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int *local_18;
  int *local_10;
  int local_4;
  
  local_1c = 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  dVar3 = sqrt((double)in_EDI);
  local_24 = (int)dVar3 + 1;
  local_2c = 0;
  local_1c = 2;
  do {
    if (local_24 < local_1c) {
      local_24 = local_4;
      local_28 = 0;
      for (local_1c = 0; local_1c < local_2c; local_1c = local_1c + 1) {
        for (; iVar2 = local_28, local_24 % aiStack_438[local_1c] == 0;
            local_24 = local_24 / aiStack_438[local_1c]) {
          local_28 = local_28 + 1;
          local_838[iVar2] = aiStack_438[local_1c];
        }
      }
      if (local_28 == 0) {
        local_28 = 1;
        local_838[0] = local_4;
      }
      *local_10 = 1;
      *local_18 = 1;
      for (local_1c = local_28 + -1; -1 < local_1c; local_1c = local_1c + -1) {
        if (*local_18 < *local_10) {
          *local_18 = local_838[local_1c] * *local_18;
        }
        else {
          *local_10 = local_838[local_1c] * *local_10;
        }
      }
      return;
    }
    bVar1 = true;
    for (local_20 = 0; local_20 < local_2c; local_20 = local_20 + 1) {
      if (local_1c % aiStack_438[local_20] == 0) {
        bVar1 = false;
        break;
      }
    }
    if (bVar1) {
      local_2c = local_2c + 1;
      if (0x100 < local_2c) {
        printf("Overflow in grid_factor\n");
      }
      aiStack_438[local_2c + -1] = local_1c;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void grid_factor(int p, int *idx, int *idy) {
  int i, j; 
  int ip, ifac, pmax, prime[MAX_FACTOR];
  int fac[MAX_FACTOR];
  int ix, iy, ichk;

  i = 1;
/**
 *   factor p completely
 *   first, find all prime numbers, besides 1, less than or equal to 
 *   the square root of p
 */
  ip = (int)(sqrt((double)p))+1;
  pmax = 0;
  for (i=2; i<=ip; i++) {
    ichk = 1;
    for (j=0; j<pmax; j++) {
      if (i%prime[j] == 0) {
        ichk = 0;
        break;
      }
    }
    if (ichk) {
      pmax = pmax + 1;
      if (pmax > MAX_FACTOR) printf("Overflow in grid_factor\n");
      prime[pmax-1] = i;
    }
  }
/**
 *   find all prime factors of p
 */
  ip = p;
  ifac = 0;
  for (i=0; i<pmax; i++) {
    while(ip%prime[i] == 0) {
      ifac = ifac + 1;
      fac[ifac-1] = prime[i];
      ip = ip/prime[i];
    }
  }
/**
 *  p is prime
 */
  if (ifac==0) {
    ifac++;
    fac[0] = p;
  }
/**
 *    find two factors of p of approximately the
 *    same size
 */
  *idx = 1;
  *idy = 1;
  for (i = ifac-1; i >= 0; i--) {
    ix = *idx;
    iy = *idy;
    if (ix <= iy) {
      *idx = fac[i]*(*idx);
    } else {
      *idy = fac[i]*(*idy);
    }
  }
}